

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitview.h
# Opt level: O0

size_t __thiscall
bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>::popcount
          (bitview<bv::internal::bitarray_t<4096UL>::array> *this,size_t begin,size_t end)

{
  bool bVar1;
  bitview<bv::internal::bitarray_t<4096UL>::array> *this_00;
  ulong begin_00;
  word_type value;
  size_t sVar2;
  size_t in_RDX;
  size_t in_RSI;
  size_t p;
  size_t step;
  size_t result;
  size_t rem;
  size_t len;
  size_t in_stack_ffffffffffffff98;
  size_t sVar3;
  undefined8 local_48;
  undefined8 local_8;
  
  bVar1 = is_empty_range(in_RSI,in_RDX);
  if (bVar1) {
    local_8 = 0;
  }
  else {
    sVar3 = in_RSI;
    size((bitview<bv::internal::bitarray_t<4096UL>::array> *)0x15092e);
    check_valid_range(sVar3,in_stack_ffffffffffffff98,0x150940);
    this_00 = (bitview<bv::internal::bitarray_t<4096UL>::array> *)(in_RDX - in_RSI);
    begin_00 = (ulong)this_00 & 0x3f;
    local_8 = 0;
    for (local_48 = in_RSI; local_48 < in_RDX; local_48 = sVar3 + local_48) {
      sVar3 = begin_00;
      if ((bitview<bv::internal::bitarray_t<4096UL>::array> *)0x3f < this_00) {
        sVar3 = 0x40;
      }
      value = get(this_00,begin_00,local_8);
      sVar2 = popcount<unsigned_long,void>(value);
      local_8 = sVar2 + local_8;
      this_00 = (bitview<bv::internal::bitarray_t<4096UL>::array> *)((long)this_00 - sVar3);
    }
  }
  return local_8;
}

Assistant:

size_t bitview<Container>::popcount(size_t begin, size_t end) const
        {
            if(is_empty_range(begin, end))
                return 0;
            
            check_valid_range(begin, end, size());
            
            size_t len = (end - begin);
            size_t rem = len % W;
            
            size_t result = 0;
            for(size_t step, p = begin;
                p < end;
                len -= step, p += step)
            {
                step = len < W ? rem : W;
                
                result += ::bv::internal::popcount(get(p, p + step));
            }
            
            return result;
        }